

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall FIX::Message::Message(Message *this,string *string,bool validate)

{
  message_order local_48;
  
  local_48.m_mode = normal;
  local_48._4_8_ = 0;
  local_48.m_groupOrder._4_8_ = 0;
  local_48._20_8_ = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_48);
  shared_array<int>::~shared_array(&local_48.m_groupOrder);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001fd438;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  setString(this,string,validate);
  return;
}

Assistant:

EXCEPT(InvalidMessage)
    : m_validStructure(true),
      m_tag(0) {
  setString(string, validate);
}